

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.cpp
# Opt level: O2

SRes crnlib::LzmaDec_DecodeToDic
               (CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  Byte *buf;
  Byte BVar1;
  uint uVar2;
  uint uVar3;
  UInt32 UVar4;
  UInt16 *pUVar5;
  ELzmaDummy EVar6;
  int iVar7;
  long lVar8;
  Byte *bufLimit;
  SizeT inSize;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  inSize = *srcLen;
  *srcLen = 0;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  buf = p->tempBuf;
  do {
    uVar2 = p->remainLen;
    if (uVar2 == 0x112) {
      UVar4 = p->code;
      if (UVar4 == 0) {
        *status = LZMA_STATUS_FINISHED_WITH_MARK;
      }
      return (uint)(UVar4 != 0);
    }
    if (p->needFlush != 0) {
      uVar3 = p->tempBufSize;
      lVar8 = 0;
      while( true ) {
        uVar9 = uVar3 + (int)lVar8;
        if (inSize - lVar8 == 0) break;
        if (4 < uVar9) goto LAB_0017bba5;
        BVar1 = src[lVar8];
        p->tempBufSize = uVar3 + (int)lVar8 + 1;
        buf[lVar8 + (ulong)uVar3] = BVar1;
        *srcLen = *srcLen + 1;
        lVar8 = lVar8 + 1;
      }
      if (uVar9 < 5) goto LAB_0017bde8;
LAB_0017bba5:
      if (*buf != '\0') {
        return 1;
      }
      uVar3 = *(uint *)(p->tempBuf + 1);
      p->code = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      p->range = 0xffffffff;
      p->needFlush = 0;
      src = src + lVar8;
      p->tempBufSize = 0;
      inSize = inSize - lVar8;
    }
    uVar12 = p->dicPos;
    if (dicLimit <= uVar12) {
      if (uVar2 != 0) {
        if (finishMode == LZMA_FINISH_ANY) {
LAB_0017bdb1:
          *status = LZMA_STATUS_NOT_FINISHED;
          return 0;
        }
        goto LAB_0017bda1;
      }
      if (p->code == 0) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return 0;
      }
      if (finishMode == LZMA_FINISH_ANY) goto LAB_0017bdb1;
    }
    if (p->needInitState != 0) {
      uVar2 = (p->prop).lp;
      uVar3 = (p->prop).lc;
      pUVar5 = p->probs;
      for (uVar10 = 0; (0x300 << ((char)uVar2 + (char)uVar3 & 0x1fU)) + 0x736 != uVar10;
          uVar10 = uVar10 + 1) {
        pUVar5[uVar10] = 0x400;
      }
      p->reps[3] = 1;
      p->state = 0;
      p->reps[0] = 1;
      p->reps[1] = 1;
      p->reps[2] = 1;
      p->needInitState = 0;
    }
    uVar10 = (ulong)p->tempBufSize;
    if (uVar10 == 0) {
      if (inSize < 0x14 || dicLimit <= uVar12) {
        EVar6 = LzmaDec_TryDummy(p,src,inSize);
        if (EVar6 == DUMMY_ERROR) {
          memcpy(buf,src,inSize);
          p->tempBufSize = (uint)inSize;
          *srcLen = *srcLen + inSize;
          goto LAB_0017bde8;
        }
        bufLimit = src;
        if ((dicLimit <= uVar12) && (EVar6 != DUMMY_MATCH)) goto LAB_0017bda1;
      }
      else {
        bufLimit = src + (inSize - 0x14);
      }
      p->buf = src;
      iVar7 = LzmaDec_DecodeReal2(p,dicLimit,bufLimit);
      if (iVar7 != 0) {
        return 1;
      }
      uVar12 = (long)p->buf - (long)src;
      *srcLen = *srcLen + uVar12;
    }
    else {
      for (uVar11 = 0; (uVar10 < 0x14 && (uVar11 < inSize)); uVar11 = uVar11 + 1) {
        p->tempBuf[uVar10] = src[uVar11];
        uVar10 = uVar10 + 1;
      }
      p->tempBufSize = (uint)uVar10;
      if (dicLimit <= uVar12 || uVar10 < 0x14) {
        EVar6 = LzmaDec_TryDummy(p,buf,uVar10);
        if (EVar6 == DUMMY_ERROR) {
          *srcLen = *srcLen + uVar11;
LAB_0017bde8:
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return 0;
        }
        if ((dicLimit <= uVar12) && (EVar6 != DUMMY_MATCH)) {
LAB_0017bda1:
          *status = LZMA_STATUS_NOT_FINISHED;
          return 1;
        }
      }
      p->buf = buf;
      iVar7 = LzmaDec_DecodeReal2(p,dicLimit,buf);
      if (iVar7 != 0) {
        return 1;
      }
      uVar12 = (ulong)(((int)uVar11 - (uint)uVar10) + (*(int *)&p->buf - (int)buf));
      *srcLen = *srcLen + uVar12;
      p->tempBufSize = 0;
    }
    src = src + uVar12;
    inSize = inSize - uVar12;
  } while( true );
}

Assistant:

SRes LzmaDec_DecodeToDic(CLzmaDec* p, SizeT dicLimit, const Byte* src, SizeT* srcLen,
                         ELzmaFinishMode finishMode, ELzmaStatus* status) {
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);

  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart) {
    int checkEndMarkNow;

    if (p->needFlush != 0) {
      for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
        p->tempBuf[p->tempBufSize++] = *src++;
      if (p->tempBufSize < RC_INIT_SIZE) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      if (p->tempBuf[0] != 0)
        return SZ_ERROR_DATA;

      LzmaDec_InitRc(p, p->tempBuf);
      p->tempBufSize = 0;
    }

    checkEndMarkNow = 0;
    if (p->dicPos >= dicLimit) {
      if (p->remainLen == 0 && p->code == 0) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return SZ_OK;
      }
      if (finishMode == LZMA_FINISH_ANY) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_OK;
      }
      if (p->remainLen != 0) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_ERROR_DATA;
      }
      checkEndMarkNow = 1;
    }

    if (p->needInitState)
      LzmaDec_InitStateReal(p);

    if (p->tempBufSize == 0) {
      SizeT processed;
      const Byte* bufLimit;
      if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, src, inSize);
        if (dummyRes == DUMMY_ERROR) {
          memcpy(p->tempBuf, src, inSize);
          p->tempBufSize = (unsigned)inSize;
          (*srcLen) += inSize;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        bufLimit = src;
      } else
        bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
      p->buf = src;
      if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
        return SZ_ERROR_DATA;
      processed = (SizeT)(p->buf - src);
      (*srcLen) += processed;
      src += processed;
      inSize -= processed;
    } else {
      unsigned rem = p->tempBufSize, lookAhead = 0;
      while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
        p->tempBuf[rem++] = src[lookAhead++];
      p->tempBufSize = rem;
      if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
        if (dummyRes == DUMMY_ERROR) {
          (*srcLen) += lookAhead;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
      }
      p->buf = p->tempBuf;
      if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
        return SZ_ERROR_DATA;
      lookAhead -= (rem - (unsigned)(p->buf - p->tempBuf));
      (*srcLen) += lookAhead;
      src += lookAhead;
      inSize -= lookAhead;
      p->tempBufSize = 0;
    }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}